

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileDrainer.cpp
# Opt level: O1

void __thiscall
adios2::burstbuffer::FileDrainer::AddOperation(FileDrainer *this,FileDrainOperation *operation)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->operationsMutex);
  if (iVar1 == 0) {
    std::
    deque<adios2::burstbuffer::FileDrainOperation,_std::allocator<adios2::burstbuffer::FileDrainOperation>_>
    ::push_back(&(this->operations).c,operation);
    pthread_mutex_unlock((pthread_mutex_t *)&this->operationsMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void FileDrainer::AddOperation(FileDrainOperation &operation)
{
    std::lock_guard<std::mutex> lockGuard(operationsMutex);
    operations.push(operation);
}